

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidates
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  wchar_t *pwVar1;
  ulong uVar2;
  bool bVar3;
  allocator local_e1;
  wstring local_e0 [32];
  reference local_c0;
  TWord *c;
  iterator __end1_1;
  iterator __begin1_1;
  TWords *__range1_1;
  undefined1 local_98 [8];
  TWords candidates;
  TWord local_70;
  reference local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *w;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *__range1;
  TWords words;
  size_t position_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *sentence_local;
  TSpellCorrector *this_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *results;
  
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)position;
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::begin(sentence);
  w = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::end(sentence);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                                     *)&w), bVar3) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ::operator*(&__end1);
    TWord::TWord(&local_70,local_60);
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1,&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ::operator++(&__end1);
  }
  GetCandidatesRaw((TWords *)local_98,this,(TWords *)&__range1,
                   (size_t)words.
                           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1_1 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::begin
                       ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_98);
  c = (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::end
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_98);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
                             *)&c), bVar3) {
    local_c0 = __gnu_cxx::
               __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
               ::operator*(&__end1_1);
    pwVar1 = local_c0->Ptr;
    uVar2 = local_c0->Len;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_e0,pwVar1,uVar2,&local_e1);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_e0);
    std::__cxx11::wstring::~wstring(local_e0);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_e1);
    __gnu_cxx::
    __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_98);
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::wstring> TSpellCorrector::GetCandidates(const std::vector<std::wstring>& sentence, size_t position) const {
    TWords words;
    for (auto&& w: sentence) {
        words.push_back(TWord(w));
    }
    TWords candidates = GetCandidatesRaw(words, position);
    std::vector<std::wstring> results;
    for (auto&& c: candidates) {
        results.push_back(std::wstring(c.Ptr, c.Len));
    }
    return results;
}